

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O1

int __thiscall geemuboi::core::CPU::add_hl_hl(CPU *this)

{
  byte bVar1;
  Registers *pRVar2;
  byte bVar3;
  byte bVar4;
  
  pRVar2 = this->regs;
  bVar1 = pRVar2->h;
  bVar4 = pRVar2->f & 0x80;
  pRVar2->f = bVar4;
  bVar3 = bVar1;
  if (((char)pRVar2->l < '\0') && (bVar3 = bVar1 + 1, bVar3 == 0)) {
    pRVar2->f = bVar4 | 0x30;
    bVar3 = 0;
  }
  pRVar2->l = pRVar2->l * '\x02';
  if (0xf < (bVar3 & 0xf) + (bVar1 & 0xf)) {
    pRVar2->f = pRVar2->f | 0x20;
  }
  if (0xff < (uint)bVar3 + (uint)bVar1) {
    pRVar2->f = pRVar2->f | 0x10;
  }
  pRVar2->h = bVar3 + bVar1;
  return 2;
}

Assistant:

int CPU::add_hl_hl() {
    add_hl_r16(regs.h, regs.l);
    return 2;
}